

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

CURLcode bindlocal(Curl_easy *data,connectdata *conn,curl_socket_t sockfd,int af,uint scope)

{
  uint uVar1;
  if2ip_result_t *piVar2;
  uint16_t uVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  uint *puVar8;
  if2ip_result_t *local_568;
  if2ip_result_t *local_560;
  char local_558 [8];
  char buffer_2 [256];
  char local_448 [8];
  char buffer_1 [256];
  int local_340 [2];
  curl_off_t scope_id;
  char *scope_ptr;
  int h_af;
  int ip_version;
  char buffer [256];
  if2ip_result_t local_220;
  int local_21c;
  if2ip_result_t if2ip_result;
  int done;
  char myhost [256];
  undefined4 local_110;
  uint local_10c;
  int on;
  int error;
  char *host;
  char *iface;
  char *host_input;
  char *iface_input;
  char *dev;
  int portnum;
  unsigned_short port;
  Curl_dns_entry *h;
  sockaddr_in6 *si6;
  sockaddr_in *si4;
  sockaddr *psStack_b8;
  curl_socklen_t sizeof_sa;
  sockaddr *sock;
  Curl_sockaddr_storage sa;
  uint scope_local;
  int af_local;
  curl_socket_t sockfd_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  psStack_b8 = (sockaddr *)&sock;
  si4._4_4_ = 0;
  si6 = (sockaddr_in6 *)&sock;
  h = (Curl_dns_entry *)&sock;
  _portnum = (Curl_dns_entry *)0x0;
  dev._6_2_ = (data->set).localport;
  dev._0_4_ = (uint)(data->set).localportrange;
  iface_input = (data->set).str[0x1e];
  host_input = (data->set).str[0x1f];
  iface = (data->set).str[0x20];
  local_560 = (if2ip_result_t *)iface_input;
  if ((if2ip_result_t *)host_input != (if2ip_result_t *)0x0) {
    local_560 = (if2ip_result_t *)host_input;
  }
  host = (char *)local_560;
  local_568 = (if2ip_result_t *)iface_input;
  if ((if2ip_result_t *)iface != (if2ip_result_t *)0x0) {
    local_568 = (if2ip_result_t *)iface;
  }
  _on = local_568;
  local_110 = 1;
  if (((local_560 == (if2ip_result_t *)0x0) && (local_568 == (if2ip_result_t *)0x0)) &&
     (dev._6_2_ == 0)) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    sa.buffer.sa_stor.__ss_align._4_4_ = scope;
    if ((local_560 == (if2ip_result_t *)0x0) || (sVar5 = strlen((char *)local_560), sVar5 < 0xff)) {
      memset(&sock,0,0x80);
      if ((host == (char *)0x0) && (_on == (if2ip_result_t *)0x0)) {
        if (af == 10) {
          *(undefined2 *)&h->addr = 10;
          uVar3 = htons(dev._6_2_);
          *(uint16_t *)((long)&h->addr + 2) = uVar3;
          si4._4_4_ = 0x1c;
        }
        else if (af == 2) {
          si6->sin6_family = 2;
          uVar3 = htons(dev._6_2_);
          si6->sin6_port = uVar3;
          si4._4_4_ = 0x10;
        }
      }
      else {
        memset(&if2ip_result,0,0x100);
        pcVar7 = host;
        local_21c = 0;
        local_220 = IF2IP_NOT_FOUND;
        if (host != (char *)0x0) {
          sVar5 = strlen(host);
          iVar4 = setsockopt(sockfd,1,0x19,pcVar7,(int)sVar5 + 1);
          if ((iVar4 == 0) && (iface == (char *)0x0)) {
            if (((data != (Curl_easy *)0x0) &&
                ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
               (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) {
              Curl_infof(data,"socket successfully bound to interface \'%s\'",host);
            }
            return CURLE_OK;
          }
        }
        if (iface == (char *)0x0) {
          local_220 = Curl_if2ip(af,sa.buffer.sa_stor.__ss_align._4_4_,conn->scope_id,host,
                                 (char *)&if2ip_result,0x100);
        }
        if (local_220 == IF2IP_NOT_FOUND) {
          if ((host_input != (char *)0x0) && (iface == (char *)0x0)) {
            puVar8 = (uint *)__errno_location();
            pcVar7 = host;
            uVar1 = *puVar8;
            (data->state).os_errno = uVar1;
            local_10c = uVar1;
            pcVar6 = Curl_strerror(uVar1,(char *)&h_af,0x100);
            Curl_failf(data,"Couldn\'t bind to interface \'%s\' with errno %d: %s",pcVar7,
                       (ulong)uVar1,pcVar6);
            return CURLE_INTERFACE_FAILED;
          }
        }
        else {
          if (local_220 == IF2IP_AF_NOT_SUPPORTED) {
            return CURLE_UNSUPPORTED_PROTOCOL;
          }
          if (local_220 == IF2IP_FOUND) {
            _on = &if2ip_result;
            if (((data != (Curl_easy *)0x0) &&
                ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
               (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) {
              Curl_infof(data,"Local Interface %s is ip %s using address family %i",host,_on,
                         (ulong)(uint)af);
            }
            local_21c = 1;
          }
        }
        if ((host_input == (char *)0x0) || (iface != (char *)0x0)) {
          scope_ptr._4_4_ = (uint)(af == 2);
          if (af == 10) {
            scope_ptr._4_4_ = 2;
          }
          Curl_resolv_blocking(data,(char *)_on,0x50,scope_ptr._4_4_,(Curl_dns_entry **)&portnum);
          if (_portnum == (Curl_dns_entry *)0x0) {
            local_21c = -1;
          }
          else {
            scope_ptr._0_4_ = _portnum->addr->ai_family;
            Curl_printable_address(_portnum->addr,(char *)&if2ip_result,0x100);
            if (((data != (Curl_easy *)0x0) &&
                ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
               (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) {
              Curl_infof(data,"Name \'%s\' family %i resolved to \'%s\' family %i",_on,
                         (ulong)(uint)af,&if2ip_result,(ulong)(uint)scope_ptr);
            }
            Curl_resolv_unlink(data,(Curl_dns_entry **)&portnum);
            if (af != (uint)scope_ptr) {
              return CURLE_UNSUPPORTED_PROTOCOL;
            }
            local_21c = 1;
          }
        }
        if (0 < local_21c) {
          if (af == 10) {
            pcVar7 = strchr((char *)&if2ip_result,0x25);
            scope_id = (curl_off_t)pcVar7;
            if (pcVar7 != (char *)0x0) {
              scope_id = (curl_off_t)(pcVar7 + 1);
              *pcVar7 = '\0';
            }
            iVar4 = inet_pton(10,(char *)&if2ip_result,&h->timestamp);
            if (0 < iVar4) {
              *(undefined2 *)&h->addr = 10;
              uVar3 = htons(dev._6_2_);
              *(uint16_t *)((long)&h->addr + 2) = uVar3;
              if (scope_id != 0) {
                iVar4 = Curl_str_number((char **)&scope_id,(curl_off_t *)local_340,0xffffffff);
                if (iVar4 != 0) {
                  return CURLE_UNSUPPORTED_PROTOCOL;
                }
                h->hostport = local_340[0];
              }
            }
            si4._4_4_ = 0x1c;
          }
          else if ((af == 2) &&
                  (iVar4 = inet_pton(2,(char *)&if2ip_result,&si6->sin6_flowinfo), 0 < iVar4)) {
            si6->sin6_family = 2;
            uVar3 = htons(dev._6_2_);
            si6->sin6_port = uVar3;
            si4._4_4_ = 0x10;
          }
        }
        if (local_21c < 1) {
          *(uint *)&(data->state).field_0x7be = *(uint *)&(data->state).field_0x7be & 0xffffffdf;
          puVar8 = (uint *)__errno_location();
          piVar2 = _on;
          uVar1 = *puVar8;
          (data->state).os_errno = uVar1;
          local_10c = uVar1;
          pcVar7 = Curl_strerror(uVar1,local_448,0x100);
          Curl_failf(data,"Couldn\'t bind to \'%s\' with errno %d: %s",piVar2,(ulong)uVar1,pcVar7);
          return CURLE_INTERFACE_FAILED;
        }
      }
      setsockopt(sockfd,0,0x18,&local_110,4);
      while (iVar4 = bind(sockfd,psStack_b8,si4._4_4_), iVar4 < 0) {
        dev._0_4_ = (uint)dev - 1;
        if (((int)(uint)dev < 1) || (dev._6_2_ = dev._6_2_ + 1, dev._6_2_ == 0)) {
          puVar8 = (uint *)__errno_location();
          uVar1 = *puVar8;
          (data->state).os_errno = uVar1;
          local_10c = uVar1;
          pcVar7 = Curl_strerror(uVar1,local_558,0x100);
          Curl_failf(data,"bind failed with errno %d: %s",(ulong)uVar1,pcVar7);
          return CURLE_INTERFACE_FAILED;
        }
        if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
           && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) {
          Curl_infof(data,"Bind to local port %d failed, trying next",(ulong)(dev._6_2_ - 1));
        }
        if (psStack_b8->sa_family == 2) {
          uVar3 = ntohs(dev._6_2_);
          si6->sin6_port = uVar3;
        }
        else {
          uVar3 = ntohs(dev._6_2_);
          *(uint16_t *)((long)&h->addr + 2) = uVar3;
        }
      }
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        Curl_infof(data,"Local port: %hu",(ulong)dev._6_2_);
      }
      conn->bits = (ConnectBits)((ulong)conn->bits & 0xffffffffffefffff | 0x100000);
      data_local._4_4_ = CURLE_OK;
    }
    else {
      data_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode bindlocal(struct Curl_easy *data, struct connectdata *conn,
                          curl_socket_t sockfd, int af, unsigned int scope)
{
  struct Curl_sockaddr_storage sa;
  struct sockaddr *sock = (struct sockaddr *)&sa;  /* bind to this address */
  curl_socklen_t sizeof_sa = 0; /* size of the data sock points to */
  struct sockaddr_in *si4 = (struct sockaddr_in *)&sa;
#ifdef USE_IPV6
  struct sockaddr_in6 *si6 = (struct sockaddr_in6 *)&sa;
#endif

  struct Curl_dns_entry *h = NULL;
  unsigned short port = data->set.localport; /* use this port number, 0 for
                                                "random" */
  /* how many port numbers to try to bind to, increasing one at a time */
  int portnum = data->set.localportrange;
  const char *dev = data->set.str[STRING_DEVICE];
  const char *iface_input = data->set.str[STRING_INTERFACE];
  const char *host_input = data->set.str[STRING_BINDHOST];
  const char *iface = iface_input ? iface_input : dev;
  const char *host = host_input ? host_input : dev;
  int error;
#ifdef IP_BIND_ADDRESS_NO_PORT
  int on = 1;
#endif
#ifndef USE_IPV6
  (void)scope;
#endif

  /*************************************************************
   * Select device to bind socket to
   *************************************************************/
  if(!iface && !host && !port)
    /* no local kind of binding was requested */
    return CURLE_OK;
  else if(iface && (strlen(iface) >= 255) )
    return CURLE_BAD_FUNCTION_ARGUMENT;

  memset(&sa, 0, sizeof(struct Curl_sockaddr_storage));

  if(iface || host) {
    char myhost[256] = "";
    int done = 0; /* -1 for error, 1 for address found */
    if2ip_result_t if2ip_result = IF2IP_NOT_FOUND;

#ifdef SO_BINDTODEVICE
    if(iface) {
      /*
       * This binds the local socket to a particular interface. This will
       * force even requests to other local interfaces to go out the external
       * interface. Only bind to the interface when specified as interface,
       * not just as a hostname or ip address.
       *
       * The interface might be a VRF, eg: vrf-blue, which means it cannot be
       * converted to an IP address and would fail Curl_if2ip. Simply try to
       * use it straight away.
       */
      if(setsockopt(sockfd, SOL_SOCKET, SO_BINDTODEVICE,
                    iface, (curl_socklen_t)strlen(iface) + 1) == 0) {
        /* This is often "errno 1, error: Operation not permitted" if you are
         * not running as root or another suitable privileged user. If it
         * succeeds it means the parameter was a valid interface and not an IP
         * address. Return immediately.
         */
        if(!host_input) {
          infof(data, "socket successfully bound to interface '%s'", iface);
          return CURLE_OK;
        }
      }
    }
#endif
    if(!host_input) {
      /* Discover IP from input device, then bind to it */
      if2ip_result = Curl_if2ip(af,
#ifdef USE_IPV6
                      scope, conn->scope_id,
#endif
                      iface, myhost, sizeof(myhost));
    }
    switch(if2ip_result) {
      case IF2IP_NOT_FOUND:
        if(iface_input && !host_input) {
          /* Do not fall back to treating it as a hostname */
          char buffer[STRERROR_LEN];
          data->state.os_errno = error = SOCKERRNO;
          failf(data, "Couldn't bind to interface '%s' with errno %d: %s",
                iface, error, Curl_strerror(error, buffer, sizeof(buffer)));
          return CURLE_INTERFACE_FAILED;
        }
        break;
      case IF2IP_AF_NOT_SUPPORTED:
        /* Signal the caller to try another address family if available */
        return CURLE_UNSUPPORTED_PROTOCOL;
      case IF2IP_FOUND:
        /*
          * We now have the numerical IP address in the 'myhost' buffer
          */
        host = myhost;
        infof(data, "Local Interface %s is ip %s using address family %i",
              iface, host, af);
        done = 1;
        break;
    }
    if(!iface_input || host_input) {
      /*
       * This was not an interface, resolve the name as a hostname
       * or IP number
       *
       * Temporarily force name resolution to use only the address type
       * of the connection. The resolve functions should really be changed
       * to take a type parameter instead.
       */
      int ip_version = (af == AF_INET) ?
                       CURL_IPRESOLVE_V4 : CURL_IPRESOLVE_WHATEVER;
#ifdef USE_IPV6
      if(af == AF_INET6)
        ip_version = CURL_IPRESOLVE_V6;
#endif

      (void)Curl_resolv_blocking(data, host, 80, ip_version, &h);
      if(h) {
        int h_af = h->addr->ai_family;
        /* convert the resolved address, sizeof myhost >= INET_ADDRSTRLEN */
        Curl_printable_address(h->addr, myhost, sizeof(myhost));
        infof(data, "Name '%s' family %i resolved to '%s' family %i",
              host, af, myhost, h_af);
        Curl_resolv_unlink(data, &h); /* this will NULL, potential free h */
        if(af != h_af) {
          /* bad IP version combo, signal the caller to try another address
             family if available */
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
        done = 1;
      }
      else {
        /*
         * provided dev was no interface (or interfaces are not supported
         * e.g. Solaris) no ip address and no domain we fail here
         */
        done = -1;
      }
    }

    if(done > 0) {
#ifdef USE_IPV6
      /* IPv6 address */
      if(af == AF_INET6) {
#ifdef HAVE_SOCKADDR_IN6_SIN6_SCOPE_ID
        char *scope_ptr = strchr(myhost, '%');
        if(scope_ptr)
          *(scope_ptr++) = '\0';
#endif
        if(curlx_inet_pton(AF_INET6, myhost, &si6->sin6_addr) > 0) {
          si6->sin6_family = AF_INET6;
          si6->sin6_port = htons(port);
#ifdef HAVE_SOCKADDR_IN6_SIN6_SCOPE_ID
          if(scope_ptr) {
            /* The "myhost" string either comes from Curl_if2ip or from
               Curl_printable_address. The latter returns only numeric scope
               IDs and the former returns none at all. So the scope ID, if
               present, is known to be numeric */
            curl_off_t scope_id;
            if(Curl_str_number((const char **)CURL_UNCONST(&scope_ptr),
                               &scope_id, UINT_MAX))
              return CURLE_UNSUPPORTED_PROTOCOL;
            si6->sin6_scope_id = (unsigned int)scope_id;
          }
#endif
        }
        sizeof_sa = sizeof(struct sockaddr_in6);
      }
      else
#endif
      /* IPv4 address */
      if((af == AF_INET) &&
         (curlx_inet_pton(AF_INET, myhost, &si4->sin_addr) > 0)) {
        si4->sin_family = AF_INET;
        si4->sin_port = htons(port);
        sizeof_sa = sizeof(struct sockaddr_in);
      }
    }

    if(done < 1) {
      /* errorbuf is set false so failf will overwrite any message already in
         the error buffer, so the user receives this error message instead of a
         generic resolve error. */
      char buffer[STRERROR_LEN];
      data->state.errorbuf = FALSE;
      data->state.os_errno = error = SOCKERRNO;
      failf(data, "Couldn't bind to '%s' with errno %d: %s",
            host, error, Curl_strerror(error, buffer, sizeof(buffer)));
      return CURLE_INTERFACE_FAILED;
    }
  }
  else {
    /* no device was given, prepare sa to match af's needs */
#ifdef USE_IPV6
    if(af == AF_INET6) {
      si6->sin6_family = AF_INET6;
      si6->sin6_port = htons(port);
      sizeof_sa = sizeof(struct sockaddr_in6);
    }
    else
#endif
    if(af == AF_INET) {
      si4->sin_family = AF_INET;
      si4->sin_port = htons(port);
      sizeof_sa = sizeof(struct sockaddr_in);
    }
  }
#ifdef IP_BIND_ADDRESS_NO_PORT
  (void)setsockopt(sockfd, SOL_IP, IP_BIND_ADDRESS_NO_PORT, &on, sizeof(on));
#endif
  for(;;) {
    if(bind(sockfd, sock, sizeof_sa) >= 0) {
      /* we succeeded to bind */
      infof(data, "Local port: %hu", port);
      conn->bits.bound = TRUE;
      return CURLE_OK;
    }

    if(--portnum > 0) {
      port++; /* try next port */
      if(port == 0)
        break;
      infof(data, "Bind to local port %d failed, trying next", port - 1);
      /* We reuse/clobber the port variable here below */
      if(sock->sa_family == AF_INET)
        si4->sin_port = ntohs(port);
#ifdef USE_IPV6
      else
        si6->sin6_port = ntohs(port);
#endif
    }
    else
      break;
  }
  {
    char buffer[STRERROR_LEN];
    data->state.os_errno = error = SOCKERRNO;
    failf(data, "bind failed with errno %d: %s",
          error, Curl_strerror(error, buffer, sizeof(buffer)));
  }

  return CURLE_INTERFACE_FAILED;
}